

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O1

O3DGCErrorCode __thiscall
o3dgc::CompressedTriangleFans::SaveIntACEGC
          (CompressedTriangleFans *this,Vector<long> *data,unsigned_long M,BinaryStream *bstream)

{
  unsigned_long value;
  uchar *puVar1;
  unsigned_long uVar2;
  uint data_00;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  CompressedTriangleFans *pCVar6;
  long lVar7;
  unsigned_long position;
  Static_Bit_Model bModel0;
  Arithmetic_Codec ace;
  Adaptive_Bit_Model bModel1;
  Adaptive_Data_Model mModelValues;
  uchar local_d9;
  unsigned_long local_d8;
  CompressedTriangleFans *local_d0;
  Static_Bit_Model local_c4;
  BinaryStream *local_c0;
  Vector<long> *local_b8;
  Arithmetic_Codec local_b0;
  Adaptive_Bit_Model local_7c;
  Adaptive_Data_Model local_68;
  
  position = (bstream->m_stream).m_size;
  value = data->m_size;
  local_d0 = this;
  BinaryStream::WriteUInt32Bin(bstream,0);
  BinaryStream::WriteUInt32Bin(bstream,value);
  if (value != 0) {
    uVar5 = (int)value * 8 + 100;
    uVar2 = 0;
    lVar7 = 0;
    do {
      lVar4 = data->m_buffer[uVar2];
      if (lVar7 < data->m_buffer[uVar2]) {
        lVar4 = lVar7;
      }
      uVar2 = uVar2 + 1;
      lVar7 = lVar4;
    } while (value != uVar2);
    local_c0 = bstream;
    local_b8 = data;
    BinaryStream::WriteUInt32Bin(bstream,lVar4 + 0x7fffffff);
    local_d8 = CONCAT44(local_d8._4_4_,uVar5);
    uVar3 = (ulong)uVar5;
    pCVar6 = local_d0;
    if (local_d0->m_sizeBufferAC < uVar3) {
      if (local_d0->m_bufferAC != (uchar *)0x0) {
        operator_delete__(local_d0->m_bufferAC);
      }
      pCVar6 = local_d0;
      local_d0->m_sizeBufferAC = uVar3;
      puVar1 = (uchar *)operator_new__(uVar3);
      pCVar6->m_bufferAC = puVar1;
    }
    Arithmetic_Codec::Arithmetic_Codec(&local_b0);
    Arithmetic_Codec::set_buffer(&local_b0,(uint)local_d8,pCVar6->m_bufferAC);
    Arithmetic_Codec::start_encoder(&local_b0);
    uVar5 = (uint)M;
    Adaptive_Data_Model::Adaptive_Data_Model(&local_68,uVar5 + 2);
    Static_Bit_Model::Static_Bit_Model(&local_c4);
    local_d8 = position;
    Adaptive_Bit_Model::Adaptive_Bit_Model(&local_7c);
    lVar7 = 0;
    do {
      uVar3 = local_b8->m_buffer[lVar7] - lVar4;
      data_00 = (uint)uVar3;
      if (uVar3 < M) {
        Arithmetic_Codec::encode(&local_b0,data_00,&local_68);
      }
      else {
        Arithmetic_Codec::encode(&local_b0,uVar5,&local_68);
        Arithmetic_Codec::ExpGolombEncode(&local_b0,data_00 - uVar5,0,&local_c4,&local_7c);
      }
      lVar7 = lVar7 + 1;
    } while (value + (value == 0) != lVar7);
    uVar5 = Arithmetic_Codec::stop_encoder(&local_b0);
    bstream = local_c0;
    pCVar6 = local_d0;
    if (uVar5 != 0) {
      uVar3 = 0;
      do {
        local_d9 = pCVar6->m_bufferAC[uVar3];
        Vector<unsigned_char>::PushBack(&bstream->m_stream,&local_d9);
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
    Adaptive_Data_Model::~Adaptive_Data_Model(&local_68);
    Arithmetic_Codec::~Arithmetic_Codec(&local_b0);
    position = local_d8;
  }
  BinaryStream::WriteUInt32Bin(bstream,position,(bstream->m_stream).m_size - position);
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    CompressedTriangleFans::SaveIntACEGC(const Vector<long> & data,
                                                            const unsigned long M,
                                                            BinaryStream & bstream) 
    {
        unsigned long start = bstream.GetSize();
        const unsigned int NMAX = data.GetSize() * 8 + 100;
        const unsigned long size       = data.GetSize();
        long minValue = 0;
        bstream.WriteUInt32Bin(0);
        bstream.WriteUInt32Bin(size);
        if (size > 0)
        {
#ifdef DEBUG_VERBOSE
            printf("-----------\nsize %i, start %i\n", size, start);
            fprintf(g_fileDebugTF, "-----------\nsize %i, start %i\n", size, start);
#endif //DEBUG_VERBOSE
            for(unsigned long i = 0; i < size; ++i)
            {
                if (minValue > data[i]) 
                {
                    minValue = data[i];
                }
#ifdef DEBUG_VERBOSE
                printf("%i\t%i\n", i, data[i]);
                fprintf(g_fileDebugTF, "%i\t%i\n", i, data[i]);
#endif //DEBUG_VERBOSE
            }
            bstream.WriteUInt32Bin(minValue + O3DGC_MAX_LONG);
            if ( m_sizeBufferAC < NMAX )
            {
                delete [] m_bufferAC;
                m_sizeBufferAC = NMAX;
                m_bufferAC     = new unsigned char [m_sizeBufferAC];
            }
            Arithmetic_Codec ace;
            ace.set_buffer(NMAX, m_bufferAC);
            ace.start_encoder();
            Adaptive_Data_Model mModelValues(M+2);
            Static_Bit_Model bModel0;
            Adaptive_Bit_Model bModel1;
            unsigned long value;
            for(unsigned long i = 0; i < size; ++i)
            {
                value = data[i]-minValue;
                if (value < M) 
                {
                    ace.encode(value, mModelValues);
                }
                else 
                {
                    ace.encode(M, mModelValues);
                    ace.ExpGolombEncode(value-M, 0, bModel0, bModel1);
                }
            }
            unsigned long encodedBytes = ace.stop_encoder();
            for(unsigned long i = 0; i < encodedBytes; ++i)
            {
                bstream.WriteUChar8Bin(m_bufferAC[i]);
            }
        }
        bstream.WriteUInt32Bin(start, bstream.GetSize() - start);
        return O3DGC_OK;
    }